

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                  *params,string *argumentType,string *argumentName)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr __n;
  size_t __n_00;
  undefined8 uVar6;
  size_type __n_01;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _Base_ptr p_Var14;
  TypeInfo *pTVar15;
  VulkanHppGenerator *this_00;
  pointer pPVar16;
  string *type;
  pointer this_01;
  bool bVar17;
  bool bVar18;
  string argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  TypeInfo *local_128;
  string *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  VulkanHppGenerator *local_b0;
  pointer local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *local_50;
  TypeInfo *local_48;
  _Base_ptr local_40;
  VulkanHppGenerator *local_38;
  
  std::operator+(&local_168,"*reinterpret_cast<",argumentType);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_168," *>( &");
  paVar13 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p == paVar11) {
    local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_148._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_148._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_148,(argumentName->_M_dataplus)._M_p,argumentName->_M_string_length);
  local_90.first._M_dataplus._M_p = (pointer)&local_90.first.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if (paVar11 == paVar12) {
    local_90.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_90.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_90.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_90.first._M_dataplus._M_p = (pointer)paVar11;
  }
  local_90.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90.first," )");
  paVar11 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar12) {
    uVar6 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    paVar11->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar13) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)(handle->second).destructorIt._M_node !=
      &(this->m_commands)._M_t._M_impl.super__Rb_tree_header) {
    local_d8 = __return_storage_ptr__;
    local_a0 = paVar11;
    getParentTypeAndName(&local_90,this,handle);
    std::operator+(&local_148,"Vk",&local_90.first);
    local_b0 = this;
    local_50 = params;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_90.first,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar13) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (handle->second).destructorIt._M_node;
    pTVar15 = (TypeInfo *)p_Var2[5]._M_parent;
    local_48 = (TypeInfo *)p_Var2[5]._M_left;
    if (pTVar15 != local_48) {
      local_38 = (VulkanHppGenerator *)&local_b0->m_structs;
      local_40 = &(local_b0->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98 = handle;
      do {
        local_120 = &pTVar15->type;
        sVar3 = (pTVar15->type)._M_string_length;
        if (((sVar3 != local_90.first._M_string_length) ||
            ((sVar3 != 0 &&
             (iVar7 = bcmp((local_120->_M_dataplus)._M_p,local_90.first._M_dataplus._M_p,sVar3),
             iVar7 != 0)))) &&
           ((sVar3 != (handle->first)._M_string_length ||
            ((sVar3 != 0 &&
             (iVar7 = bcmp((local_120->_M_dataplus)._M_p,(handle->first)._M_dataplus._M_p,sVar3),
             iVar7 != 0)))))) {
          p_Var2 = (handle->second).destructorIt._M_node;
          p_Var14 = p_Var2[5]._M_parent;
          p_Var4 = p_Var2[5]._M_left;
          bVar17 = p_Var14 == p_Var4;
          local_128 = pTVar15;
          if (!bVar17) {
            p_Var5 = (_Base_ptr)pTVar15[1].prefix._M_string_length;
            bVar17 = false;
            do {
              __n = *(_Base_ptr *)(p_Var14 + 5);
              if ((__n == p_Var5) &&
                 ((__n == (_Base_ptr)0x0 ||
                  (iVar7 = bcmp(p_Var14[4]._M_right,local_128[1].prefix._M_dataplus._M_p,(size_t)__n
                               ), iVar7 == 0)))) break;
              p_Var14 = (_Base_ptr)&p_Var14[8]._M_parent;
              bVar17 = p_Var14 == p_Var4;
            } while (!bVar17);
          }
          handle = local_98;
          pTVar15 = local_128;
          if (bVar17) {
            this_01 = (local_50->
                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_a8 = (local_50->
                       super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            bVar17 = this_01 != local_a8;
            if (bVar17) {
              sVar3 = (local_128->type)._M_string_length;
              bVar17 = true;
              pPVar16 = this_01;
              do {
                __n_00 = (pPVar16->type).type._M_string_length;
                if ((__n_00 == sVar3) &&
                   ((__n_00 == 0 ||
                    (iVar7 = bcmp((pPVar16->type).type._M_dataplus._M_p,
                                  (local_120->_M_dataplus)._M_p,__n_00), iVar7 == 0)))) break;
                pPVar16 = pPVar16 + 1;
                bVar17 = pPVar16 != local_a8;
              } while (bVar17);
            }
            if (bVar17) {
              bVar17 = isHandleType(local_b0,local_120);
              pTVar15 = local_128;
              if (bVar17) {
                bVar17 = TypeInfo::isValue(local_128);
                if (!bVar17) {
                  __assert_fail("destructorParam.type.isValue()",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x28c1,
                                "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                               );
                }
                std::operator+(&local_118,", static_cast<",local_120);
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_118,">( *");
                local_f8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                paVar13 = &pbVar8->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p == paVar13) {
                  local_f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                }
                else {
                  local_f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_f8._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_f8,local_128[1].prefix._M_dataplus._M_p,
                                   (size_type)local_128[1].prefix._M_string_length);
                local_168._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                paVar13 = &pbVar8->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p == paVar13) {
                  local_168.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_168.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                }
                else {
                  local_168.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_168._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_168," )");
                local_148._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                paVar13 = &pbVar8->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p == paVar13) {
                  local_148.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                }
                else {
                  local_148.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_148._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(local_d8,local_148._M_dataplus._M_p,local_148._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  local_148.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  local_168.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                pTVar15 = local_128;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                  pTVar15 = local_128;
                }
              }
              else {
                iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (local_120,"VkAllocationCallbacks");
                if (iVar7 != 0) {
                  __assert_fail("destructorParam.type.type == \"VkAllocationCallbacks\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x28c6,
                                "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                               );
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(local_d8,", allocator");
              }
            }
            else {
              if (this_01 == local_a8) {
LAB_0018a982:
                __assert_fail("found",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x28e5,
                              "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                             );
              }
              bVar17 = false;
              do {
                this_00 = local_38;
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                                *)local_38,&(this_01->type).type);
                if (cVar9._M_node == local_40) {
                  bVar18 = true;
                }
                else {
                  cVar10 = findStructMemberItByType
                                     (this_00,local_120,
                                      (vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                                       *)&cVar9._M_node[3]._M_right);
                  bVar18 = cVar10._M_current == *(MemberData **)(cVar9._M_node + 4);
                  if (!bVar18) {
                    bVar17 = TypeInfo::isValue(&this_01->type);
                    if (bVar17) {
                      __assert_fail("!param.type.isValue()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                    ,0x28da,
                                    "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                                   );
                    }
                    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"p","");
                    paVar13 = &local_118.field_2;
                    pcVar1 = (this_01->name)._M_dataplus._M_p;
                    local_118._M_dataplus._M_p = (pointer)paVar13;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_118,pcVar1,pcVar1 + (this_01->name)._M_string_length
                              );
                    __n_01 = local_d0._M_string_length;
                    if ((local_d0._M_string_length <= local_118._M_string_length) &&
                       ((local_d0._M_string_length == 0 ||
                        (iVar7 = bcmp(local_118._M_dataplus._M_p,local_d0._M_dataplus._M_p,
                                      local_d0._M_string_length), iVar7 == 0)))) {
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                                (&local_118,0,__n_01);
                    }
                    anon_unknown.dwarf_1900a8::startLowerCase(&local_f8,&local_118);
                    pbVar8 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             append(&local_f8,".");
                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar8->_M_dataplus)._M_p;
                    paVar12 = &pbVar8->field_2;
                    if (paVar11 == paVar12) {
                      local_168.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                      local_168.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    }
                    else {
                      local_168.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                      local_168._M_dataplus._M_p = (pointer)paVar11;
                    }
                    local_168._M_string_length = pbVar8->_M_string_length;
                    (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
                    pbVar8->_M_string_length = 0;
                    (pbVar8->field_2)._M_local_buf[0] = '\0';
                    pbVar8 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             _M_append(&local_168,((cVar10._M_current)->name)._M_dataplus._M_p,
                                       ((cVar10._M_current)->name)._M_string_length);
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar8->_M_dataplus)._M_p;
                    paVar12 = &pbVar8->field_2;
                    if (paVar11 == paVar12) {
                      local_148.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                      local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    }
                    else {
                      local_148.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                      local_148._M_dataplus._M_p = (pointer)paVar11;
                    }
                    local_148._M_string_length = pbVar8->_M_string_length;
                    (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
                    pbVar8->_M_string_length = 0;
                    (pbVar8->field_2)._M_local_buf[0] = '\0';
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                      operator_delete(local_f8._M_dataplus._M_p,
                                      local_f8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar13) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p,
                                      local_d0.field_2._M_allocated_capacity + 1);
                    }
                    type = &((cVar10._M_current)->type).type;
                    bVar17 = isHandleType(local_b0,type);
                    if (bVar17) {
                      std::operator+(&local_d0,"static_cast<",type);
                      pbVar8 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               append(&local_d0,">( ");
                      local_118._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                      paVar11 = &pbVar8->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p == paVar11) {
                        local_118.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                        local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                        local_118._M_dataplus._M_p = (pointer)paVar13;
                      }
                      else {
                        local_118.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                      }
                      local_118._M_string_length = pbVar8->_M_string_length;
                      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
                      pbVar8->_M_string_length = 0;
                      (pbVar8->field_2)._M_local_buf[0] = '\0';
                      pbVar8 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               _M_append(&local_118,local_148._M_dataplus._M_p,
                                         local_148._M_string_length);
                      local_f8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                      paVar11 = &pbVar8->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f8._M_dataplus._M_p == paVar11) {
                        local_f8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                        local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                      }
                      else {
                        local_f8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                      }
                      local_f8._M_string_length = pbVar8->_M_string_length;
                      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
                      pbVar8->_M_string_length = 0;
                      (pbVar8->field_2)._M_local_buf[0] = '\0';
                      pbVar8 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               append(&local_f8," )");
                      local_168._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                      paVar11 = &pbVar8->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_168._M_dataplus._M_p == paVar11) {
                        local_168.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                        local_168.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                      }
                      else {
                        local_168.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                      }
                      local_168._M_string_length = pbVar8->_M_string_length;
                      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
                      pbVar8->_M_string_length = 0;
                      (pbVar8->field_2)._M_local_buf[0] = '\0';
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (&local_148,&local_168);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_168._M_dataplus._M_p != &local_168.field_2) {
                        operator_delete(local_168._M_dataplus._M_p,
                                        local_168.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                        operator_delete(local_f8._M_dataplus._M_p,
                                        local_f8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != paVar13) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                        operator_delete(local_d0._M_dataplus._M_p,
                                        local_d0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::operator+(&local_168,", ",&local_148);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(local_d8,local_168._M_dataplus._M_p,local_168._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    bVar17 = true;
                  }
                }
              } while ((bVar18) && (this_01 = this_01 + 1, this_01 != local_a8));
              pTVar15 = local_128;
              handle = local_98;
              if (!bVar17) goto LAB_0018a982;
            }
          }
        }
        pTVar15 = (TypeInfo *)&pTVar15[2].postfix._M_string_length;
      } while (pTVar15 != local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.second._M_dataplus._M_p != &local_90.second.field_2) {
      operator_delete(local_90.second._M_dataplus._M_p,
                      local_90.second.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ = local_d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
      operator_delete(local_90.first._M_dataplus._M_p,
                      local_90.first.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments( std::pair<std::string, HandleData> const & handle,
                                                                                std::vector<ParamData> const &             params,
                                                                                std::string const &                        argumentType,
                                                                                std::string const &                        argumentName ) const
{
  std::string arguments = "*reinterpret_cast<" + argumentType + " *>( &" + argumentName + " )";
  if ( handle.second.destructorIt != m_commands.end() )
  {
    auto [parentType, parentName] = getParentTypeAndName( handle );
    parentType                    = "Vk" + parentType;
    for ( auto const & destructorParam : handle.second.destructorIt->second.params )
    {
      if ( ( destructorParam.type.type != parentType ) && ( destructorParam.type.type != handle.first ) &&
           std::ranges::none_of( handle.second.destructorIt->second.params,
                                 [&destructorParam]( ParamData const & pd ) { return pd.lenExpression == destructorParam.name; } ) )
      {
        if ( std::ranges::any_of( params, [&destructorParam]( ParamData const & pd ) { return pd.type.type == destructorParam.type.type; } ) )
        {
          if ( isHandleType( destructorParam.type.type ) )
          {
            assert( destructorParam.type.isValue() );
            arguments += ", static_cast<" + destructorParam.type.type + ">( *" + destructorParam.name + " )";
          }
          else
          {
            assert( destructorParam.type.type == "VkAllocationCallbacks" );
            arguments += ", allocator";
          }
        }
        else
        {
#if !defined( NDEBUG )
          bool found = false;
#endif
          for ( auto const & param : params )
          {
            auto structureIt = m_structs.find( param.type.type );
            if ( structureIt != m_structs.end() )
            {
              auto memberIt = findStructMemberItByType( destructorParam.type.type, structureIt->second.members );
              if ( memberIt != structureIt->second.members.end() )
              {
#if !defined( NDEBUG )
                found = true;
#endif
                assert( !param.type.isValue() );
                std::string argument = startLowerCase( stripPrefix( param.name, "p" ) ) + "." + memberIt->name;
                if ( isHandleType( memberIt->type.type ) )
                {
                  argument = "static_cast<" + memberIt->type.type + ">( " + argument + " )";
                }
                arguments += ", " + argument;
                break;
              }
            }
          }
          assert( found );
        }
      }
    }
  }
  return arguments;
}